

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O0

void duckdb::ChimpScanPartial<double>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  ChimpScanState<double> *this;
  double *pdVar1;
  unsigned_long uVar2;
  idx_t b;
  Vector *in_RCX;
  unsigned_long *in_RDX;
  long in_R8;
  idx_t to_scan;
  idx_t scanned;
  INTERNAL_TYPE *current_result_ptr;
  double *result_data;
  ChimpScanState<double> *scan_state;
  SegmentScanState *in_stack_ffffffffffffffb0;
  unsigned_long *values;
  ChimpScanState<double> *this_00;
  
  unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
  operator->((unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
              *)in_stack_ffffffffffffffb0);
  this = SegmentScanState::Cast<duckdb::ChimpScanState<double>>(in_stack_ffffffffffffffb0);
  pdVar1 = FlatVector::GetData<double>((Vector *)0x9ec182);
  Vector::SetVectorType(in_RCX,(VectorType)((ulong)in_R8 >> 0x38));
  this_00 = (ChimpScanState<double> *)(pdVar1 + in_R8);
  for (values = (unsigned_long *)0x0; values < in_RDX;
      values = (unsigned_long *)(uVar2 + (long)values)) {
    uVar2 = (long)in_RDX - (long)values;
    b = ChimpScanState<double>::LeftInGroup(this);
    uVar2 = MinValue<unsigned_long>(uVar2,b);
    ChimpScanState<double>::ScanGroup<unsigned_long>(this_00,values,uVar2);
  }
  return;
}

Assistant:

void ChimpScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                      idx_t result_offset) {
	using INTERNAL_TYPE = typename ChimpType<T>::TYPE;
	auto &scan_state = state.scan_state->Cast<ChimpScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	auto current_result_ptr = (INTERNAL_TYPE *)(result_data + result_offset);

	idx_t scanned = 0;
	while (scanned < scan_count) {
		idx_t to_scan = MinValue(scan_count - scanned, scan_state.LeftInGroup());
		scan_state.template ScanGroup<INTERNAL_TYPE>(current_result_ptr + scanned, to_scan);
		scanned += to_scan;
	}
}